

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_noderel.cc
# Opt level: O1

RC __thiscall QL_NodeRel::DeleteNodes(QL_NodeRel *this)

{
  if (this->relNameInitialized == true) {
    free(this->relName);
  }
  this->relNameInitialized = false;
  if ((this->super_QL_Node).listsInitialized == true) {
    free((this->super_QL_Node).attrsInRec);
  }
  (this->super_QL_Node).listsInitialized = false;
  return 0;
}

Assistant:

RC QL_NodeRel::DeleteNodes(){
  if(relNameInitialized == true){
    free(relName);
  }
  relNameInitialized = false;
  if(listsInitialized == true){
    free(attrsInRec);
  }
  listsInitialized = false;
  return (0);
}